

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionEntryPointInfo::ResetOnNativeCodeInstallFailure(FunctionEntryPointInfo *this)

{
  FunctionProxy *this_00;
  FunctionEntryPointInfo *this_local;
  
  this_00 = Memory::WriteBarrierPtr<Js::FunctionProxy>::operator->(&this->functionProxy);
  FunctionProxy::
  MapFunctionObjectTypes<Js::FunctionEntryPointInfo::ResetOnNativeCodeInstallFailure()::__0>
            (this_00,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void FunctionEntryPointInfo::ResetOnNativeCodeInstallFailure()
    {
        this->functionProxy->MapFunctionObjectTypes([&](ScriptFunctionType* functionType)
        {
            Assert(functionType->GetTypeId() == TypeIds_Function);
            if (functionType->GetEntryPointInfo() == this)
            {
                if (!this->GetIsAsmJSFunction())
                {
                    functionType->SetEntryPoint(GetCheckCodeGenThunk());
                }
#ifdef ASMJS_PLAT
                else
                {
                    functionType->SetEntryPoint(GetCheckAsmJsCodeGenThunk());
                }
#endif
            }
        });
    }